

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_property_string_set
                   (FT_Library library,FT_String *module_name,FT_String *property_name,
                   FT_String *value)

{
  FT_Error FVar1;
  FT_String *value_local;
  FT_String *property_name_local;
  FT_String *module_name_local;
  FT_Library library_local;
  
  FVar1 = ft_property_do(library,module_name,property_name,value,'\x01','\x01');
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_Error )
  ft_property_string_set( FT_Library        library,
                          const FT_String*  module_name,
                          const FT_String*  property_name,
                          FT_String*        value )
  {
    return ft_property_do( library,
                           module_name,
                           property_name,
                           (void*)value,
                           TRUE,
                           TRUE );
  }